

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie_quant.c
# Opt level: O0

lm_trie_quant_t * lm_trie_quant_read_bin(FILE *fp,int order)

{
  FILE *quant_00;
  size_t sVar1;
  lm_trie_quant_t *quant;
  int dummy;
  int order_local;
  FILE *fp_local;
  
  quant._4_4_ = order;
  _dummy = (FILE *)fp;
  fread(&quant,4,1,(FILE *)fp);
  quant_00 = (FILE *)lm_trie_quant_create(quant._4_4_);
  sVar1 = fread(quant_00->_lock,4,quant_00->_offset,_dummy);
  fp_local = quant_00;
  if (sVar1 != quant_00->_offset) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie_quant.c"
            ,0xa5,"Failed to read %d quantization values\n",quant_00->_offset);
    lm_trie_quant_free((lm_trie_quant_t *)quant_00);
    fp_local = (FILE *)0x0;
  }
  return (lm_trie_quant_t *)fp_local;
}

Assistant:

lm_trie_quant_t *
lm_trie_quant_read_bin(FILE * fp, int order)
{
    int dummy;
    lm_trie_quant_t *quant;

    fread(&dummy, sizeof(dummy), 1, fp);
    quant = lm_trie_quant_create(order);
    if (fread(quant->values, sizeof(*quant->values),
              quant->nvalues, fp) != quant->nvalues) {
        E_ERROR("Failed to read %d quantization values\n",
                quant->nvalues);
        lm_trie_quant_free(quant);
        return NULL;
    }
    if (SWAP_LM_TRIE) {
        size_t i;
        for (i = 0; i < quant->nvalues; ++i)
            SWAP_FLOAT32(&quant->values[i]);
    }

    return quant;
}